

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int autoIncBegin(Parse *pParse,int iDb,Table *pTab)

{
  int iVar1;
  AutoincInfo *pAVar2;
  int iVar3;
  Parse *pPVar4;
  
  iVar3 = 0;
  if ((pTab->tabFlags & 8) != 0) {
    pPVar4 = pParse->pToplevel;
    if (pParse->pToplevel == (Parse *)0x0) {
      pPVar4 = pParse;
    }
    pAVar2 = (AutoincInfo *)&pPVar4->pAinc;
    do {
      pAVar2 = pAVar2->pNext;
      if (pAVar2 == (AutoincInfo *)0x0) {
        pAVar2 = (AutoincInfo *)sqlite3DbMallocRaw(pParse->db,0x18);
        if (pAVar2 == (AutoincInfo *)0x0) {
          return 0;
        }
        pAVar2->pNext = pPVar4->pAinc;
        pPVar4->pAinc = pAVar2;
        pAVar2->pTab = pTab;
        pAVar2->iDb = iDb;
        iVar1 = pPVar4->nMem;
        iVar3 = iVar1 + 2;
        pAVar2->regCtr = iVar3;
        pPVar4->nMem = iVar1 + 3;
        return iVar3;
      }
    } while (pAVar2->pTab != pTab);
    iVar3 = pAVar2->regCtr;
  }
  return iVar3;
}

Assistant:

static int autoIncBegin(
  Parse *pParse,      /* Parsing context */
  int iDb,            /* Index of the database holding pTab */
  Table *pTab         /* The table we are writing to */
){
  int memId = 0;      /* Register holding maximum rowid */
  if( pTab->tabFlags & TF_Autoincrement ){
    Parse *pToplevel = sqlite3ParseToplevel(pParse);
    AutoincInfo *pInfo;

    pInfo = pToplevel->pAinc;
    while( pInfo && pInfo->pTab!=pTab ){ pInfo = pInfo->pNext; }
    if( pInfo==0 ){
      pInfo = sqlite3DbMallocRaw(pParse->db, sizeof(*pInfo));
      if( pInfo==0 ) return 0;
      pInfo->pNext = pToplevel->pAinc;
      pToplevel->pAinc = pInfo;
      pInfo->pTab = pTab;
      pInfo->iDb = iDb;
      pToplevel->nMem++;                  /* Register to hold name of table */
      pInfo->regCtr = ++pToplevel->nMem;  /* Max rowid register */
      pToplevel->nMem++;                  /* Rowid in sqlite_sequence */
    }
    memId = pInfo->regCtr;
  }
  return memId;
}